

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void state_FRC(Context *ctx)

{
  int iVar1;
  char *reason;
  
  if (((ctx->dest_arg).result_mod & 1) == 0) {
    iVar1 = shader_version_atleast(ctx,'\x02','\0');
    if ((iVar1 != 0) || (((ctx->dest_arg).writemask & 0xfffffffeU) == 2)) {
      return;
    }
    reason = "FRC writemask must be .y or .xy for shader model 1.x";
  }
  else {
    reason = "FRC destination can\'t use saturate modifier";
  }
  fail(ctx,reason);
  return;
}

Assistant:

static void state_FRC(Context *ctx)
{
    const DestArgInfo *dst = &ctx->dest_arg;

    if (dst->result_mod & MOD_SATURATE)  // according to msdn...
        fail(ctx, "FRC destination can't use saturate modifier");

    else if (!shader_version_atleast(ctx, 2, 0))
    {
        if (!writemask_y(dst->writemask) && !writemask_xy(dst->writemask))
            fail(ctx, "FRC writemask must be .y or .xy for shader model 1.x");
    } // else if
}